

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * boost::filesystem::detail::dot_path(void)

{
  int iVar1;
  
  if (dot_path()::dot_pth == '\0') {
    iVar1 = __cxa_guard_acquire(&dot_path()::dot_pth);
    if (iVar1 != 0) {
      path::path(&dot_path::dot_pth,".");
      __cxa_atexit(path::~path,&dot_path::dot_pth,&__dso_handle);
      __cxa_guard_release(&dot_path()::dot_pth);
    }
  }
  return &dot_path::dot_pth;
}

Assistant:

BOOST_FILESYSTEM_DECL
    const path&  dot_path()
    {
#   ifdef BOOST_WINDOWS_API
      static const fs::path dot_pth(L".");
#   else
      static const fs::path dot_pth(".");
#   endif
      return dot_pth;
    }